

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

void __thiscall Centaurus::CharClass<wchar_t>::CharClass(CharClass<wchar_t> *this,wchar_t ch)

{
  Range<wchar_t> local_28;
  wchar_t local_14;
  CharClass<wchar_t> *pCStack_10;
  wchar_t ch_local;
  CharClass<wchar_t> *this_local;
  
  this->_vptr_CharClass = (_func_int **)&PTR__CharClass_0028f4e0;
  local_14 = ch;
  pCStack_10 = this;
  std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::vector
            (&this->m_ranges);
  Range<wchar_t>::make_from_wide(&local_28,local_14,local_14 + L'\x01');
  std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::push_back
            (&this->m_ranges,&local_28);
  Range<wchar_t>::~Range(&local_28);
  return;
}

Assistant:

CharClass(wchar_t ch)
    {
        m_ranges.push_back(Range<TCHAR>::make_from_wide(ch, ch + 1));
    }